

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv4Transmitter::LeaveAllMulticastGroups(RTPUDPv4Transmitter *this)

{
  uint uVar1;
  HashElement *pHVar2;
  HashElement *pHVar3;
  uint uVar4;
  ip_mreq mreq;
  
  if ((this->init == true) && (this->created == true)) {
    pHVar3 = (this->multicastgroups).firsthashelem;
    (this->multicastgroups).curhashelem = pHVar3;
    while (pHVar3 != (HashElement *)0x0) {
      uVar1 = pHVar3->element;
      uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = this->mcastifaceIP;
      mreq.imr_interface.s_addr =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      mreq.imr_multiaddr.s_addr = uVar4;
      setsockopt(this->rtpsock,0,0x24,&mreq,8);
      if (this->rtpsock != this->rtcpsock) {
        uVar1 = this->mcastifaceIP;
        mreq.imr_interface.s_addr =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        mreq.imr_multiaddr.s_addr = uVar4;
        setsockopt(this->rtcpsock,0,0x24,&mreq,8);
      }
      pHVar2 = (this->multicastgroups).curhashelem;
      pHVar3 = (HashElement *)0x0;
      if (pHVar2 != (HashElement *)0x0) {
        pHVar3 = pHVar2->listnext;
        (this->multicastgroups).curhashelem = pHVar3;
      }
    }
    RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::Clear
              (&this->multicastgroups);
  }
  return;
}

Assistant:

void RTPUDPv4Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			uint32_t mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			
			RTPUDPV4TRANS_MCASTMEMBERSHIP(rtpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			if (rtpsock != rtcpsock) // no need to leave multicast group twice when multiplexing
				RTPUDPV4TRANS_MCASTMEMBERSHIP(rtcpsock,IP_DROP_MEMBERSHIP,mcastIP,status);
			JRTPLIB_UNUSED(status);

			multicastgroups.GotoNextElement();
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}